

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlib.cpp
# Opt level: O0

void init_module_testlib(void)

{
  class_<Derived2,boost::python::bases<Derived,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::shared_ptr<Derived2>,boost::noncopyable_::noncopyable>
  *pcVar1;
  class_<Derived2,_boost::python::bases<Derived,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::shared_ptr<Derived2>,_boost::noncopyable_::noncopyable>
  local_50;
  code *local_48;
  undefined8 local_40;
  class_<Derived,_boost::python::bases<Base,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::shared_ptr<Derived>,_boost::noncopyable_::noncopyable>
  local_38 [3];
  code *local_20;
  undefined8 local_18;
  class_<Base,_boost::shared_ptr<Base>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
  local_10;
  
  boost::python::
  class_<Base,_boost::shared_ptr<Base>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
  ::class_(&local_10,"Base","Describes Base");
  local_20 = Base::SomeBaseFunc;
  local_18 = 0;
  boost::python::
  class_<Base,boost::shared_ptr<Base>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::def<void(Base::*)(),char[23]>
            ((class_<Base,boost::shared_ptr<Base>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              *)&local_10,"SomeBaseFunc",(first_type)Base::SomeBaseFunc,(char (*) [23])0x0);
  boost::python::
  class_<Base,_boost::shared_ptr<Base>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
  ::~class_(&local_10);
  boost::python::
  class_<Derived,_boost::python::bases<Base,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::shared_ptr<Derived>,_boost::noncopyable_::noncopyable>
  ::class_(local_38,"Derived","Describes Derived");
  local_48 = Derived::SomeDerivedFunc;
  local_40 = 0;
  boost::python::
  class_<Derived,boost::python::bases<Base,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::shared_ptr<Derived>,boost::noncopyable_::noncopyable>
  ::def<void(Derived::*)(),char[26]>
            ((class_<Derived,boost::python::bases<Base,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::shared_ptr<Derived>,boost::noncopyable_::noncopyable>
              *)local_38,"SomeDerivedFunc",(first_type)Derived::SomeDerivedFunc,(char (*) [26])0x0);
  boost::python::
  class_<Derived,_boost::python::bases<Base,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::shared_ptr<Derived>,_boost::noncopyable_::noncopyable>
  ::~class_(local_38);
  boost::python::
  class_<Derived2,_boost::python::bases<Derived,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::shared_ptr<Derived2>,_boost::noncopyable_::noncopyable>
  ::class_(&local_50,"Derived2","Describes Derived2");
  pcVar1 = (class_<Derived2,boost::python::bases<Derived,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::shared_ptr<Derived2>,boost::noncopyable_::noncopyable>
            *)boost::python::
              class_<Derived2,boost::python::bases<Derived,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::shared_ptr<Derived2>,boost::noncopyable_::noncopyable>
              ::def<void(Base::*)(),char[23]>
                        ((class_<Derived2,boost::python::bases<Derived,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::shared_ptr<Derived2>,boost::noncopyable_::noncopyable>
                          *)&local_50,"SomeBaseFunc",(first_type)Base::SomeBaseFunc,
                         (char (*) [23])0x0);
  pcVar1 = (class_<Derived2,boost::python::bases<Derived,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::shared_ptr<Derived2>,boost::noncopyable_::noncopyable>
            *)boost::python::
              class_<Derived2,boost::python::bases<Derived,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::shared_ptr<Derived2>,boost::noncopyable_::noncopyable>
              ::def<void(Derived::*)(),char[26]>
                        (pcVar1,"SomeDerivedFunc",(first_type)Derived::SomeDerivedFunc,
                         (char (*) [26])0x0);
  boost::python::
  class_<Derived2,boost::python::bases<Derived,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::shared_ptr<Derived2>,boost::noncopyable_::noncopyable>
  ::def<void(Derived2::*)(),char[27]>
            (pcVar1,"SomeDerived2Func",(first_type)Derived2::SomeDerived2Func,(char (*) [27])0x0);
  boost::python::
  class_<Derived2,_boost::python::bases<Derived,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::shared_ptr<Derived2>,_boost::noncopyable_::noncopyable>
  ::~class_(&local_50);
  boost::python::def<boost::shared_ptr<Derived>(*)(),char[24]>
            ("CreateDerived",CreateDerived,(char (*) [24])"Describes CreateDerived");
  boost::python::def<boost::shared_ptr<Derived>(*)(),char[25]>
            ("CreateDerived2",CreateDerived2,(char (*) [25])"Describes CreateDerived2");
  return;
}

Assistant:

BOOST_PYTHON_MODULE(testlib)
{
    bp::class_<Base, boost::shared_ptr<Base>, boost::noncopyable>("Base", "Describes Base")
        .def("SomeBaseFunc", &Base::SomeBaseFunc, "Describes SomeBaseFunc");

    bp::class_<Derived, bp::bases<Base>, boost::shared_ptr<Derived>, boost::noncopyable>("Derived", "Describes Derived")
        .def("SomeDerivedFunc", &Derived::SomeDerivedFunc, "Describes SomeDerivedFunc");

    bp::class_<Derived2, bp::bases<Derived>, boost::shared_ptr<Derived2>, boost::noncopyable>("Derived2", "Describes Derived2")
        .def("SomeBaseFunc", &Base::SomeBaseFunc, "Describes SomeBaseFunc")
        .def("SomeDerivedFunc", &Derived::SomeDerivedFunc, "Describes SomeDerivedFunc")
        .def("SomeDerived2Func", &Derived2::SomeDerived2Func, "Describes SomeDerived2Func");

    bp::def("CreateDerived", CreateDerived, "Describes CreateDerived");
    bp::def("CreateDerived2", CreateDerived2, "Describes CreateDerived2");
}